

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
UA_Server_setMethodNode_callback
          (UA_Server *server,UA_NodeId methodNodeId,UA_MethodCallback method,void *handle)

{
  UA_NodeStoreEntry *pUVar1;
  UA_StatusCode UVar2;
  UA_NodeStoreEntry **ppUVar3;
  
  ppUVar3 = findNode(server->nodestore,&methodNodeId);
  if (ppUVar3 == (UA_NodeStoreEntry **)0x0) {
    UVar2 = 0x80340000;
  }
  else {
    pUVar1 = *ppUVar3;
    UVar2 = 0x805f0000;
    if ((pUVar1->node).nodeClass == UA_NODECLASS_METHOD) {
      pUVar1[1].node.nodeId.identifier.string.length = (size_t)method;
      *(void **)&pUVar1[1].node.nodeId = handle;
      UVar2 = 0;
    }
  }
  return UVar2;
}

Assistant:

UA_StatusCode
UA_Server_setMethodNode_callback(UA_Server *server, const UA_NodeId methodNodeId,
                                 UA_MethodCallback method, void *handle) {
    struct addMethodCallback cb = { method, handle };
    UA_RCU_LOCK();
    UA_StatusCode retval = UA_Server_editNode(server, &adminSession,
                                              &methodNodeId, editMethodCallback, &cb);
    UA_RCU_UNLOCK();
    return retval;
}